

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O3

int __thiscall gl4cts::PostDepthShaderCase::init(PostDepthShaderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  NotSupportedError *this_00;
  string local_40;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_post_depth_coverage")
  ;
  if (bVar1) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_vertShader,0,(char *)(this->m_vertShader)._M_string_length,0x1aaf658)
    ;
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_fragShader1,0,(char *)(this->m_fragShader1)._M_string_length,
               0x1aaebd6);
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_fragShader2,0,(char *)(this->m_fragShader2)._M_string_length,
               0x1aaec65);
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_fragShader3,0,(char *)(this->m_fragShader3)._M_string_length,
               0x1aaedd7);
    iVar2 = std::__cxx11::string::_M_replace
                      ((ulong)&this->m_fragShader4,0,(char *)(this->m_fragShader4)._M_string_length,
                       0x1aaeea7);
    return iVar2;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"GL_ARB_post_depth_coverage not supported","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PostDepthShaderCase::init()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_post_depth_coverage"))
		throw tcu::NotSupportedError("GL_ARB_post_depth_coverage not supported");

	m_vertShader = c_commonVertShader;

	m_fragShader1 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : require\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader2 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"#ifndef GL_ARB_post_depth_coverage\n"
					"  #error GL_ARB_post_depth_coverage not defined\n"
					"#else\n"
					"  #if (GL_ARB_post_depth_coverage != 1)\n"
					"    #error GL_ARB_post_depth_coverage wrong defined\n"
					"  #endif\n"
					"#endif // GL_ARB_post_depth_coverage\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader3 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"layout(early_fragment_tests) in;\n"
					"layout(post_depth_coverage) in;\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader4 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"layout(post_depth_coverage) in;\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";
}